

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
cmTargetInternals::CheckImportedLibName(cmTargetInternals *this,string *prop,string *value)

{
  cmMakefile *pcVar1;
  ulong uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long local_c0;
  size_type bad;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *value_local;
  string *prop_local;
  cmTargetInternals *this_local;
  
  local_28 = value;
  value_local = prop;
  prop_local = (string *)this;
  if ((this->TargetType != INTERFACE_LIBRARY) || ((this->IsImportedTarget & 1U) == 0)) {
    pcVar1 = this->Makefile;
    std::operator+(&local_48,prop," property may be set only on imported INTERFACE library targets."
                  );
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    return false;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_28);
    if (*pcVar3 == '-') {
      pcVar1 = this->Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bad,
                     value_local," property value\n  ");
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bad,
                     local_28);
      std::operator+(&local_78,&local_98,"\nmay not start with \'-\'.");
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&bad);
      return false;
    }
    local_c0 = std::__cxx11::string::find_first_of((char *)local_28,0x8ac2b4);
    if (local_c0 != -1) {
      pcVar1 = this->Makefile;
      std::operator+(&local_160,value_local," property value\n  ");
      std::operator+(&local_140,&local_160,local_28);
      std::operator+(&local_120,&local_140,"\nmay not contain \'");
      std::__cxx11::string::substr((ulong)&local_180,(ulong)local_28);
      std::operator+(&local_100,&local_120,&local_180);
      std::operator+(&local_e0,&local_100,"\'.");
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      return false;
    }
  }
  return true;
}

Assistant:

bool cmTargetInternals::CheckImportedLibName(std::string const& prop,
                                             std::string const& value) const
{
  if (this->TargetType != cmStateEnums::INTERFACE_LIBRARY ||
      !this->IsImportedTarget) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      prop +
        " property may be set only on imported INTERFACE library targets.");
    return false;
  }
  if (!value.empty()) {
    if (value[0] == '-') {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                   prop + " property value\n  " + value +
                                     "\nmay not start with '-'.");
      return false;
    }
    std::string::size_type bad = value.find_first_of(":/\\;");
    if (bad != std::string::npos) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                   prop + " property value\n  " + value +
                                     "\nmay not contain '" +
                                     value.substr(bad, 1) + "'.");
      return false;
    }
  }
  return true;
}